

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOChrono.cpp
# Opt level: O3

void __thiscall adios2::profiling::JSONProfiler::JSONProfiler(JSONProfiler *this,Comm *comm)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  string local_40;
  
  (this->m_Profiler).m_Timers._M_h._M_buckets = &(this->m_Profiler).m_Timers._M_h._M_single_bucket;
  (this->m_Profiler).m_Timers._M_h._M_bucket_count = 1;
  (this->m_Profiler).m_Timers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_Profiler).m_Timers._M_h._M_element_count = 0;
  (this->m_Profiler).m_Timers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_Profiler).m_Timers._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_Profiler).m_Timers._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = &(this->m_Profiler).m_Bytes;
  (this->m_Profiler).m_Bytes._M_h._M_buckets = &(this->m_Profiler).m_Bytes._M_h._M_single_bucket;
  (this->m_Profiler).m_Bytes._M_h._M_bucket_count = 1;
  (this->m_Profiler).m_Bytes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_Profiler).m_Bytes._M_h._M_element_count = 0;
  (this->m_Profiler).m_Bytes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_Profiler).m_Bytes._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_Profiler).m_Bytes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->m_RankMPI = 0;
  this->m_Comm = comm;
  (this->m_Profiler).m_IsActive = true;
  paVar2 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"buffering","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ES","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"PP","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ES_meta1_gather","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ES_meta2_gather","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ES_write_metadata","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"MetadataBlockWrite","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ES_AGG1","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ES_GatherMetadataBlocks","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ES_simple_meta","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ES_simple_gather","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ES_meta1","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ES_meta2","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ES_aggregate_info","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ES_gather_write_meta","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"FixedMetaInfoGather","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"MetaInfoBcast","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SelectMetaInfoGather","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ES_close","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ES_AWD","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"WaitOnAsync","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"BS_WaitOnAsync","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"DC_WaitOnAsync1","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"DC_WaitOnAsync2","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"PDW","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"DeriveVars","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = local_40._M_dataplus._M_p & 0xffffffff00000000;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<char_const(&)[10],int>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"buffering");
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"DataRead","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = local_40._M_dataplus._M_p & 0xffffffff00000000;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<char_const(&)[9],int>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"dataread");
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"MetaDataRead","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = local_40._M_dataplus._M_p & 0xffffffff00000000;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<char_const(&)[13],int>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"metadataread");
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"MetaMetaDataRead","");
  AddTimerWatch(this,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_40._M_dataplus._M_p = local_40._M_dataplus._M_p & 0xffffffff00000000;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<char_const(&)[17],int>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar1,"metadmetaataread");
  iVar3 = helper::Comm::Rank(this->m_Comm);
  this->m_RankMPI = iVar3;
  return;
}

Assistant:

JSONProfiler::JSONProfiler(helper::Comm const &comm) : m_Comm(comm)
{
    m_Profiler.m_IsActive = true; // default is true

    AddTimerWatch("buffering");
    AddTimerWatch("ES");
    AddTimerWatch("PP");
    AddTimerWatch("ES_meta1_gather", false);
    AddTimerWatch("ES_meta2_gather", false);
    AddTimerWatch("ES_write_metadata", false);
    AddTimerWatch("MetadataBlockWrite", false);
    AddTimerWatch("ES_AGG1", false);
    AddTimerWatch("ES_GatherMetadataBlocks", false);
    AddTimerWatch("ES_simple_meta", false);
    AddTimerWatch("ES_simple_gather", false);

    AddTimerWatch("ES_meta1");
    AddTimerWatch("ES_meta2");

    AddTimerWatch("ES_aggregate_info", false);
    AddTimerWatch("ES_gather_write_meta", false);
    AddTimerWatch("FixedMetaInfoGather", false);
    AddTimerWatch("MetaInfoBcast", false);
    AddTimerWatch("SelectMetaInfoGather", false);

    AddTimerWatch("ES_close");
    AddTimerWatch("ES_AWD");
    AddTimerWatch("WaitOnAsync");
    AddTimerWatch("BS_WaitOnAsync");
    AddTimerWatch("DC_WaitOnAsync1");
    AddTimerWatch("DC_WaitOnAsync2");
    AddTimerWatch("PDW");

    AddTimerWatch("DeriveVars");

    m_Profiler.m_Bytes.emplace("buffering", 0);
    AddTimerWatch("DataRead");
    m_Profiler.m_Bytes.emplace("dataread", 0);
    AddTimerWatch("MetaDataRead");
    m_Profiler.m_Bytes.emplace("metadataread", 0);
    AddTimerWatch("MetaMetaDataRead");
    m_Profiler.m_Bytes.emplace("metadmetaataread", 0);

    m_RankMPI = m_Comm.Rank();
}